

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# densehashtable.h
# Opt level: O1

void __thiscall
google::
dense_hashtable<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>,_char,_std::hash<char>,_google::dense_hash_map<char,_std::vector<CMString,_std::allocator<CMString>_>_*,_std::hash<char>,_std::equal_to<char>,_google::libc_allocator_with_realloc<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>_>_>::SelectKey,_google::dense_hash_map<char,_std::vector<CMString,_std::allocator<CMString>_>_*,_std::hash<char>,_std::equal_to<char>,_google::libc_allocator_with_realloc<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>_>_>::SetKey,_std::equal_to<char>,_google::libc_allocator_with_realloc<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>_>_>
::clear_to_size(dense_hashtable<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>,_char,_std::hash<char>,_google::dense_hash_map<char,_std::vector<CMString,_std::allocator<CMString>_>_*,_std::hash<char>,_std::equal_to<char>,_google::libc_allocator_with_realloc<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>_>_>::SelectKey,_google::dense_hash_map<char,_std::vector<CMString,_std::allocator<CMString>_>_*,_std::hash<char>,_std::equal_to<char>,_google::libc_allocator_with_realloc<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>_>_>::SetKey,_std::equal_to<char>,_google::libc_allocator_with_realloc<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>_>_>
                *this,size_type new_num_buckets)

{
  char *pcVar1;
  pointer ppVar2;
  vector<CMString,_std::allocator<CMString>_> *pvVar3;
  pointer ppVar4;
  ulong uVar5;
  long lVar6;
  float fVar7;
  
  if (this->table == (pointer)0x0) {
    ppVar4 = (pointer)malloc(new_num_buckets << 4);
  }
  else {
    if (this->num_buckets == new_num_buckets) goto LAB_0010ee53;
    ppVar4 = alloc_impl<google::libc_allocator_with_realloc<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>_>_>
             ::realloc_or_die((alloc_impl<google::libc_allocator_with_realloc<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>_>_>
                               *)&this->val_info,this->table,new_num_buckets);
  }
  this->table = ppVar4;
LAB_0010ee53:
  ppVar2 = this->table;
  if (ppVar2 != (pointer)0x0) {
    if (new_num_buckets != 0) {
      lVar6 = 0;
      do {
        pvVar3 = (this->val_info).emptyval.second;
        pcVar1 = &ppVar2->first + lVar6;
        *(undefined8 *)pcVar1 = *(undefined8 *)&(this->val_info).emptyval;
        *(vector<CMString,_std::allocator<CMString>_> **)(pcVar1 + 8) = pvVar3;
        lVar6 = lVar6 + 0x10;
      } while (new_num_buckets << 4 != lVar6);
    }
    this->num_deleted = 0;
    this->num_elements = 0;
    this->num_buckets = new_num_buckets;
    fVar7 = (this->settings).super_sh_hashtable_settings<char,_std::hash<char>,_unsigned_long,_4>.
            enlarge_factor_ * (float)new_num_buckets;
    uVar5 = (ulong)fVar7;
    (this->settings).super_sh_hashtable_settings<char,_std::hash<char>,_unsigned_long,_4>.
    enlarge_threshold_ = (long)(fVar7 - 9.223372e+18) & (long)uVar5 >> 0x3f | uVar5;
    fVar7 = (float)new_num_buckets *
            (this->settings).super_sh_hashtable_settings<char,_std::hash<char>,_unsigned_long,_4>.
            shrink_factor_;
    uVar5 = (ulong)fVar7;
    (this->settings).super_sh_hashtable_settings<char,_std::hash<char>,_unsigned_long,_4>.
    shrink_threshold_ = (long)(fVar7 - 9.223372e+18) & (long)uVar5 >> 0x3f | uVar5;
    (this->settings).super_sh_hashtable_settings<char,_std::hash<char>,_unsigned_long,_4>.
    consider_shrink_ = false;
    return;
  }
  __assert_fail("table",
                "/workspace/llm4binary/github/license_all_cmakelists_25/TETYYS[P]ConfusableMatcher/sparsehash/src/sparsehash/internal/densehashtable.h"
                ,0x314,
                "void google::dense_hashtable<std::pair<const char, std::vector<CMString> *>, char, std::hash<char>, google::dense_hash_map<char, std::vector<CMString> *>::SelectKey, google::dense_hash_map<char, std::vector<CMString> *>::SetKey, std::equal_to<char>, google::libc_allocator_with_realloc<std::pair<const char, std::vector<CMString> *>>>::clear_to_size(size_type) [Value = std::pair<const char, std::vector<CMString> *>, Key = char, HashFcn = std::hash<char>, ExtractKey = google::dense_hash_map<char, std::vector<CMString> *>::SelectKey, SetKey = google::dense_hash_map<char, std::vector<CMString> *>::SetKey, EqualKey = std::equal_to<char>, Alloc = google::libc_allocator_with_realloc<std::pair<const char, std::vector<CMString> *>>]"
               );
}

Assistant:

void clear_to_size(size_type new_num_buckets) {
    if (!table) {
      table = val_info.allocate(new_num_buckets);
    } else {
      destroy_buckets(0, num_buckets);
      if (new_num_buckets != num_buckets) {   // resize, if necessary
        typedef base::integral_constant<bool,
            base::is_same<value_alloc_type,
                          libc_allocator_with_realloc<value_type> >::value>
            realloc_ok;
        resize_table(num_buckets, new_num_buckets, realloc_ok());
      }
    }
    assert(table);
    fill_range_with_empty(table, table + new_num_buckets);
    num_elements = 0;
    num_deleted = 0;
    num_buckets = new_num_buckets;          // our new size
    settings.reset_thresholds(bucket_count());
  }